

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

string * httplib::detail::decode_url(string *__return_storage_ptr__,string *s)

{
  char cVar1;
  pointer pcVar2;
  ulong in_RAX;
  undefined1 uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  bool bVar11;
  char buff [4];
  undefined8 uStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar5 = s->_M_string_length;
  if (uVar5 != 0) {
    uVar6 = 0;
    uStack_38 = in_RAX;
    do {
      pcVar2 = (s->_M_dataplus)._M_p;
      cVar8 = (char)__return_storage_ptr__;
      if (((pcVar2[uVar6] == '+') || (pcVar2[uVar6] != '%')) || (uVar5 <= uVar6 + 1)) {
        std::__cxx11::string::push_back(cVar8);
      }
      else if (pcVar2[uVar6 + 1] == 'u') {
        uVar4 = 0;
        bVar11 = false;
        if (uVar6 + 2 < uVar5) {
          lVar7 = 0;
          uVar4 = 0;
          do {
            cVar1 = pcVar2[lVar7 + uVar6 + 2];
            iVar9 = (int)cVar1;
            if (cVar1 == '\0') {
LAB_00147057:
              bVar11 = false;
              goto LAB_00147059;
            }
            uVar10 = iVar9 - 0x30;
            bVar11 = true;
            if (cVar1 < ' ' || 9 < uVar10) {
              if ((byte)(cVar1 + 0xbfU) < 6) {
                uVar10 = iVar9 - 0x37;
              }
              else {
                uVar10 = iVar9 - 0x57;
                bVar11 = (byte)(cVar1 + 0x9fU) < 6;
                if (!bVar11) {
                  uVar10 = 0;
                }
              }
            }
            if (!bVar11) goto LAB_00147057;
            uVar4 = uVar4 * 0x10 + uVar10;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
          bVar11 = true;
        }
LAB_00147059:
        if (bVar11) {
          uVar3 = (undefined1)uVar4;
          if ((int)uVar4 < 0x80) {
            uStack_38 = CONCAT35(uStack_38._5_3_,CONCAT14(uVar3,(undefined4)uStack_38)) &
                        0xffffff7fffffffff;
LAB_001470d8:
            bVar11 = false;
          }
          else {
            if ((int)uVar4 < 0x800) {
              uVar5 = CONCAT35(uStack_38._5_3_,CONCAT14((char)(uVar4 >> 6),(undefined4)uStack_38)) &
                      0xffffff1fffffffff;
              uStack_38._6_2_ = (undefined2)(uVar5 >> 0x30);
              uStack_38 = CONCAT26(uStack_38._6_2_,CONCAT15(uVar3,(int5)uVar5)) & 0xffff3fffffffffff
                          | 0x80c000000000;
              goto LAB_001470d8;
            }
            if ((int)uVar4 < 0xd800) {
LAB_001470af:
              uVar5 = CONCAT35(uStack_38._5_3_,CONCAT14((char)(uVar4 >> 0xc),(undefined4)uStack_38))
                      & 0xffffff0fffffffff;
              uStack_38._6_2_ = (undefined2)(uVar5 >> 0x30);
              uVar5 = CONCAT26(uStack_38._6_2_,CONCAT15((char)(uVar4 >> 6),(int5)uVar5)) &
                      0xffff3fffffffffff;
              uStack_38._7_1_ = (undefined1)(uVar5 >> 0x38);
              uStack_38 = CONCAT17(uStack_38._7_1_,CONCAT16(uVar3,(int6)uVar5)) & 0xff3fffffffffffff
                          | 0x8080e000000000;
              goto LAB_001470d8;
            }
            bVar11 = true;
            if (0xdfff < (int)uVar4) {
              if ((int)uVar4 < 0x10000) goto LAB_001470af;
              if ((int)uVar4 < 0x110000) {
                uStack_38 = CONCAT17(uVar3,CONCAT16((char)(uVar4 >> 6),
                                                    CONCAT15((char)(uVar4 >> 0xc),
                                                             CONCAT14((char)(uVar4 >> 0x12),
                                                                      (undefined4)uStack_38)))) &
                            0x3f3f3f07ffffffff | 0x808080f000000000;
                goto LAB_001470d8;
              }
            }
          }
          if (!bVar11) {
            std::__cxx11::string::append((char *)__return_storage_ptr__,(long)&uStack_38 + 4);
          }
          uVar6 = uVar6 + 5;
        }
        else {
          std::__cxx11::string::push_back(cVar8);
        }
      }
      else {
        lVar7 = 0;
        do {
          cVar1 = pcVar2[lVar7 + uVar6 + 1];
          if (cVar1 == '\0') {
LAB_0014702d:
            bVar11 = false;
            goto LAB_0014702f;
          }
          bVar11 = true;
          if ((cVar1 < ' ' || 9 < (int)cVar1 - 0x30U) && (5 < (byte)(cVar1 + 0xbfU))) {
            bVar11 = (byte)(cVar1 + 0x9fU) < 6;
          }
          if (!bVar11) goto LAB_0014702d;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 2);
        bVar11 = true;
LAB_0014702f:
        if (bVar11) {
          std::__cxx11::string::push_back(cVar8);
          uVar6 = uVar6 + 2;
        }
        else {
          std::__cxx11::string::push_back(cVar8);
        }
      }
      uVar6 = uVar6 + 1;
      uVar5 = s->_M_string_length;
    } while (uVar6 < uVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string decode_url(const std::string& s)
{
    std::string result;

    for (size_t i = 0; i < s.size(); i++) {
        if (s[i] == '%' && i + 1 < s.size()) {
            if (s[i + 1] == 'u') {
                int val = 0;
                if (from_hex_to_i(s, i + 2, 4, val)) {
                    // 4 digits Unicode codes
                    char buff[4];
                    size_t len = to_utf8(val, buff);
                    if (len > 0) {
                        result.append(buff, len);
                    }
                    i += 5; // 'u0000'
                } else {
                    result += s[i];
                }
            } else {
                int val = 0;
                if (from_hex_to_i(s, i + 1, 2, val)) {
                    // 2 digits hex codes
                    result += val;
                    i += 2; // '00'
                } else {
                    result += s[i];
                }
            }
        } else if (s[i] == '+') {
            result += ' ';
        } else {
            result += s[i];
        }
    }

    return result;
}